

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

put_transaction<MessageInABottle> * __thiscall
density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
start_emplace<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
          (put_transaction<MessageInABottle> *__return_storage_ptr__,
          heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *this)

{
  ControlBlock *this_00;
  runtime_type<> *prVar1;
  runtime_type<> rVar2;
  put_transaction<MessageInABottle> local_50;
  runtime_type<> *local_38;
  runtime_type<> *type_storage;
  runtime_type<> *type;
  Allocation push_data;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *this_local;
  
  push_data.m_user_storage = this;
  _type = inplace_allocate<0ul,true,8ul,8ul>(this);
  type_storage = (runtime_type<> *)0x0;
  prVar1 = heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           type_after_control((ControlBlock *)type);
  local_38 = prVar1;
  rVar2 = runtime_type<>::
          make<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>();
  prVar1->m_feature_table = rVar2.m_feature_table;
  this_00 = push_data.m_control_block;
  type_storage = prVar1;
  memset(push_data.m_control_block,0,8);
  density_tests::heterogeneous_queue_samples::MessageInABottle::MessageInABottle
            ((MessageInABottle *)this_00);
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::put_transaction
            (&local_50,0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             this,_type);
  put_transaction<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>::
  put_transaction<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle,void>
            ((put_transaction<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
              *)__return_storage_ptr__,&local_50);
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::~put_transaction(&local_50);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = inplace_allocate<
              0,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(RUNTIME_TYPE::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  0);
                push_data.m_control_block->m_next += detail::Queue_Dead;
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }